

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void ClipperLib::Minkowski(Path *poly,Path *path,Paths *solution,bool isSum,bool isClosed)

{
  long *plVar1;
  pointer pIVar2;
  pointer pIVar3;
  bool bVar4;
  ulong uVar5;
  size_type __n;
  long lVar6;
  ulong uVar7;
  size_type __n_00;
  size_type sVar8;
  size_t j;
  ulong uVar9;
  Path p;
  Paths pp;
  IntPoint local_48;
  
  pIVar2 = (poly->super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  pIVar3 = (poly->super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
           _M_impl.super__Vector_impl_data._M_start;
  __n_00 = (long)(path->
                 super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(path->
                 super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
                 _M_impl.super__Vector_impl_data._M_start >> 4;
  pp.
  super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  pp.
  super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pp.
  super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::reserve(&pp,__n_00);
  __n = (long)pIVar2 - (long)pIVar3 >> 4;
  if (isSum) {
    for (sVar8 = 0; sVar8 != __n_00; sVar8 = sVar8 + 1) {
      p.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      p.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      p.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::reserve
                ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
                 &p.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,
                 __n);
      lVar6 = 0;
      for (uVar9 = 0;
          pIVar2 = (poly->
                   super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
                   _M_impl.super__Vector_impl_data._M_start,
          uVar9 < (ulong)((long)(poly->
                                super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pIVar2 >> 4);
          uVar9 = uVar9 + 1) {
        pIVar3 = (path->
                 super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
                 _M_impl.super__Vector_impl_data._M_start + sVar8;
        plVar1 = (long *)((long)&pIVar2->X + lVar6);
        local_48.X = *plVar1 + pIVar3->X;
        local_48.Y = plVar1[1] + pIVar3->Y;
        std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
        emplace_back<ClipperLib::IntPoint>
                  ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
                   &p.
                    super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,
                   &local_48);
        lVar6 = lVar6 + 0x10;
      }
      std::
      vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
      ::push_back(&pp,(value_type *)
                      &p.
                       super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                 );
      std::_Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::~_Vector_base
                (&p.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>)
      ;
    }
  }
  else {
    for (sVar8 = 0; sVar8 != __n_00; sVar8 = sVar8 + 1) {
      p.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      p.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      p.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::reserve
                ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
                 &p.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,
                 __n);
      lVar6 = 0;
      for (uVar9 = 0;
          pIVar2 = (poly->
                   super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
                   _M_impl.super__Vector_impl_data._M_start,
          uVar9 < (ulong)((long)(poly->
                                super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pIVar2 >> 4);
          uVar9 = uVar9 + 1) {
        pIVar3 = (path->
                 super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
                 _M_impl.super__Vector_impl_data._M_start + sVar8;
        plVar1 = (long *)((long)&pIVar2->X + lVar6);
        local_48.X = pIVar3->X - *plVar1;
        local_48.Y = pIVar3->Y - plVar1[1];
        std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
        emplace_back<ClipperLib::IntPoint>
                  ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
                   &p.
                    super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,
                   &local_48);
        lVar6 = lVar6 + 0x10;
      }
      std::
      vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
      ::push_back(&pp,(value_type *)
                      &p.
                       super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                 );
      std::_Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::~_Vector_base
                (&p.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>)
      ;
    }
  }
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::clear(solution);
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::reserve(solution,(__n + 1) * ((uint)isClosed + __n_00));
  uVar9 = 0;
  while (uVar5 = uVar9, uVar5 != __n_00 - ((ulong)(uint)isClosed ^ 1)) {
    uVar7 = 0;
    while (uVar9 = uVar5 + 1, __n != uVar7) {
      p.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      p.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      p.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::reserve
                ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
                 &p.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,
                 4);
      std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::push_back
                ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
                 &p.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,
                 pp.
                 super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar5 % __n_00].
                 super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                 _M_impl.super__Vector_impl_data._M_start + uVar7 % __n);
      uVar9 = (uVar5 + 1) % __n_00;
      std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::push_back
                ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
                 &p.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,
                 pp.
                 super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar9].
                 super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                 _M_impl.super__Vector_impl_data._M_start + uVar7 % __n);
      uVar7 = uVar7 + 1;
      std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::push_back
                ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
                 &p.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,
                 pp.
                 super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar9].
                 super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                 _M_impl.super__Vector_impl_data._M_start + uVar7 % __n);
      std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::push_back
                ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
                 &p.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,
                 pp.
                 super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar5 % __n_00].
                 super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                 _M_impl.super__Vector_impl_data._M_start + uVar7 % __n);
      bVar4 = Orientation((Path *)&p.
                                   super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                         );
      if (!bVar4) {
        ReversePath((Path *)&p.
                             super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                   );
      }
      std::
      vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
      ::push_back(solution,(value_type *)
                           &p.
                            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                 );
      std::_Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::~_Vector_base
                (&p.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>)
      ;
    }
  }
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::~vector(&pp);
  return;
}

Assistant:

void Minkowski(const Path& poly, const Path& path, 
  Paths& solution, bool isSum, bool isClosed)
{
  int delta = (isClosed ? 1 : 0);
  size_t polyCnt = poly.size();
  size_t pathCnt = path.size();
  Paths pp;
  pp.reserve(pathCnt);
  if (isSum)
    for (size_t i = 0; i < pathCnt; ++i)
    {
      Path p;
      p.reserve(polyCnt);
      for (size_t j = 0; j < poly.size(); ++j)
        p.push_back(IntPoint(path[i].X + poly[j].X, path[i].Y + poly[j].Y));
      pp.push_back(p);
    }
  else
    for (size_t i = 0; i < pathCnt; ++i)
    {
      Path p;
      p.reserve(polyCnt);
      for (size_t j = 0; j < poly.size(); ++j)
        p.push_back(IntPoint(path[i].X - poly[j].X, path[i].Y - poly[j].Y));
      pp.push_back(p);
    }

  solution.clear();
  solution.reserve((pathCnt + delta) * (polyCnt + 1));
  for (size_t i = 0; i < pathCnt - 1 + delta; ++i)
    for (size_t j = 0; j < polyCnt; ++j)
    {
      Path quad;
      quad.reserve(4);
      quad.push_back(pp[i % pathCnt][j % polyCnt]);
      quad.push_back(pp[(i + 1) % pathCnt][j % polyCnt]);
      quad.push_back(pp[(i + 1) % pathCnt][(j + 1) % polyCnt]);
      quad.push_back(pp[i % pathCnt][(j + 1) % polyCnt]);
      if (!Orientation(quad)) ReversePath(quad);
      solution.push_back(quad);
    }
}